

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O0

void ares_process_fd(ares_channel_t *channel,ares_socket_t read_fd,ares_socket_t write_fd)

{
  ulong local_30;
  size_t nevents;
  ares_fd_events_t events [2];
  ares_socket_t write_fd_local;
  ares_socket_t read_fd_local;
  ares_channel_t *channel_local;
  
  events[1].fd = write_fd;
  events[1].events = read_fd;
  memset(&nevents,0,0x10);
  if (events[1].events != 0xffffffff) {
    nevents._0_4_ = events[1].events;
    nevents._4_4_ = nevents._4_4_ | 1;
  }
  local_30 = (ulong)(events[1].events != 0xffffffff);
  if (events[1].fd != -1) {
    if (events[1].fd != events[1].events) {
      local_30 = local_30 + 1;
    }
    events[local_30 - 2].fd = events[1].fd;
    events[local_30 - 2].events = events[local_30 - 2].events | 2;
  }
  ares_process_fds(channel,(ares_fd_events_t *)&nevents,local_30,0);
  return;
}

Assistant:

void ares_process_fd(ares_channel_t *channel, ares_socket_t read_fd,
                     ares_socket_t write_fd)
{
  ares_fd_events_t events[2];
  size_t           nevents = 0;

  memset(events, 0, sizeof(events));

  if (read_fd != ARES_SOCKET_BAD) {
    nevents++;
    events[nevents - 1].fd      = read_fd;
    events[nevents - 1].events |= ARES_FD_EVENT_READ;
  }

  if (write_fd != ARES_SOCKET_BAD) {
    if (write_fd != read_fd) {
      nevents++;
    }
    events[nevents - 1].fd      = write_fd;
    events[nevents - 1].events |= ARES_FD_EVENT_WRITE;
  }

  ares_process_fds(channel, events, nevents, ARES_PROCESS_FLAG_NONE);
}